

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

size_t google::protobuf::internal::SerialArena::FreeStringBlocks
                 (StringBlock *string_block,size_t unused_bytes)

{
  StringBlock *pSVar1;
  StringBlock *pSVar2;
  long *plVar3;
  StringBlock *pSVar4;
  StringBlock *__range3;
  long *plVar5;
  StringBlock *pSVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  
  if (string_block == (StringBlock *)0x0) {
    FreeStringBlocks((SerialArena *)&stack0xffffffffffffffc8);
  }
  else {
    pSVar1 = string_block->next_;
    uVar7 = (ulong)string_block->allocated_size_;
    if (unused_bytes <= uVar7 - 0x10) {
      if ((long)&string_block[1].next_ + unused_bytes != (long)&string_block->next_ + uVar7) {
        lVar8 = (uVar7 - unused_bytes) + -0x10;
        plVar3 = (long *)((long)&string_block->next_ + unused_bytes);
        do {
          plVar5 = plVar3 + 4;
          if (plVar5 != (long *)plVar3[2]) {
            operator_delete((long *)plVar3[2],*plVar5 + 1);
          }
          lVar8 = lVar8 + -0x20;
          plVar3 = plVar5;
        } while (lVar8 != 0);
      }
      if (string_block->heap_allocated_ == true) {
        sVar9 = (size_t)string_block->allocated_size_;
        operator_delete(string_block,sVar9);
      }
      else {
        sVar9 = 0;
      }
      while (pSVar1 != (StringBlock *)0x0) {
        pSVar2 = pSVar1->next_;
        if ((ulong)pSVar1->allocated_size_ != 0x10) {
          lVar8 = (ulong)pSVar1->allocated_size_ - 0x10;
          pSVar4 = pSVar1;
          do {
            pSVar6 = pSVar4 + 2;
            if (pSVar6 != pSVar4[1].next_) {
              operator_delete(pSVar4[1].next_,(ulong)((long)&pSVar6->next_->next_ + 1));
            }
            lVar8 = lVar8 + -0x20;
            pSVar4 = pSVar6;
          } while (lVar8 != 0);
        }
        if (pSVar1->heap_allocated_ == true) {
          uVar7 = (ulong)pSVar1->allocated_size_;
          operator_delete(pSVar1,uVar7);
        }
        else {
          uVar7 = 0;
        }
        sVar9 = sVar9 + uVar7;
        pSVar1 = pSVar2;
      }
      return sVar9;
    }
  }
  FreeStringBlocks();
}

Assistant:

size_t SerialArena::FreeStringBlocks(StringBlock* string_block,
                                     size_t unused_bytes) {
  ABSL_DCHECK(string_block != nullptr);
  StringBlock* next = string_block->next();
  absl::PrefetchToLocalCacheNta(next);
  std::string* end = string_block->end();
  for (std::string* s = string_block->AtOffset(unused_bytes); s != end; ++s) {
    s->~basic_string();
  }
  size_t deallocated = StringBlock::Delete(string_block);

  while ((string_block = next) != nullptr) {
    next = string_block->next();
    absl::PrefetchToLocalCacheNta(next);
    for (std::string& s : *string_block) {
      s.~basic_string();
    }
    deallocated += StringBlock::Delete(string_block);
  }
  return deallocated;
}